

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kcpu.h
# Opt level: O0

void m68ki_write_8_fc(uint address,uint fc,uint value)

{
  uint value_local;
  uint fc_local;
  uint address_local;
  
  my_fc_handler(fc);
  value_local = address;
  if (m68ki_cpu.pmmu_enabled != 0) {
    value_local = pmmu_translate_addr(address);
  }
  m68k_write_memory_8(value_local & m68ki_cpu.address_mask,value);
  return;
}

Assistant:

static inline void m68ki_write_8_fc(uint address, uint fc, uint value)
{
	(void)fc;
	m68ki_set_fc(fc); /* auto-disable (see m68kcpu.h) */

#if M68K_EMULATE_PMMU
	if (PMMU_ENABLED)
	    address = pmmu_translate_addr(address);
#endif

	m68k_write_memory_8(ADDRESS_68K(address), value);
}